

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboInvalidateTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::InvalidateSubFboRenderCase::render
          (InvalidateSubFboRenderCase *this,Surface *dst)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  ChannelOrder CVar2;
  int iVar3;
  deUint32 program;
  int iVar4;
  Context *pCVar6;
  deUint32 *attachments_00;
  uint uVar7;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  int local_24c;
  int local_248;
  deUint32 fbo;
  Vector<float,_4> local_240;
  Vec4 local_230;
  ulong local_220;
  ulong local_218;
  TextureFormat colorFmt;
  Vec4 cScale;
  Vector<float,_4> local_1f8;
  Surface *local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> attachments;
  TextureFormatInfo colorFmtInfo;
  FlatColorShader flatShader;
  TextureFormat TVar5;
  
  local_1e8 = dst;
  colorFmt = glu::mapGLInternalFormat(this->m_colorFmt);
  if (this->m_depthStencilFmt == 0) {
    CVar2 = CHANNELORDER_LAST;
  }
  else {
    TVar5 = glu::mapGLInternalFormat(this->m_depthStencilFmt);
    CVar2 = TVar5.order;
  }
  tcu::getTextureFormatInfo(&colorFmtInfo,&colorFmt);
  tcu::operator-((tcu *)&cScale,&colorFmtInfo.valueMax,&colorFmtInfo.valueMin);
  fbo = 0;
  colorRbo = 0;
  depthStencilRbo = 0;
  this_00 = &(this->super_FboTestCase).super_ContextWrapper;
  local_248 = sglr::ContextWrapper::getWidth(this_00);
  local_248 = local_248 / 4;
  local_24c = sglr::ContextWrapper::getHeight(this_00);
  local_24c = local_24c / 4;
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  local_218 = (long)iVar3 / 2 & 0xffffffff;
  iVar3 = sglr::ContextWrapper::getHeight(this_00);
  local_220 = (long)iVar3 / 2 & 0xffffffff;
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  getFBODiscardAttachments(&attachments,this->m_invalidateBuffers);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  program = (*pCVar6->_vptr_Context[0x75])(pCVar6,&flatShader);
  sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&colorRbo);
  sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,colorRbo);
  dVar1 = this->m_colorFmt;
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,dVar1,iVar3,iVar4);
  if (this->m_depthStencilFmt != 0) {
    sglr::ContextWrapper::glGenRenderbuffers(this_00,1,&depthStencilRbo);
    sglr::ContextWrapper::glBindRenderbuffer(this_00,0x8d41,depthStencilRbo);
    dVar1 = this->m_depthStencilFmt;
    iVar3 = sglr::ContextWrapper::getWidth(this_00);
    iVar4 = sglr::ContextWrapper::getHeight(this_00);
    sglr::ContextWrapper::glRenderbufferStorage(this_00,0x8d41,dVar1,iVar3,iVar4);
  }
  sglr::ContextWrapper::glGenFramebuffers(this_00,1,&fbo);
  sglr::ContextWrapper::glBindFramebuffer(this_00,0x8d40,fbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8ce0,0x8d41,colorRbo);
  if ((CVar2 == DS) || (CVar2 == D)) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d00,0x8d41,depthStencilRbo);
  }
  if (CVar2 - S < 2) {
    sglr::ContextWrapper::glFramebufferRenderbuffer(this_00,0x8d40,0x8d20,0x8d41,depthStencilRbo);
  }
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  local_1f8.m_data[0] = 0.0;
  local_1f8.m_data[1] = 0.0;
  local_1f8.m_data[2] = 0.0;
  local_1f8.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_240,&local_1f8,&cScale);
  tcu::operator+((tcu *)&local_230,&local_240,&colorFmtInfo.valueMin);
  sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,local_230.m_data);
  sglr::ContextWrapper::glClearBufferfi(this_00,0x84f9,0,1.0,0);
  sglr::ContextWrapper::glEnable(this_00,0xb71);
  sglr::ContextWrapper::glEnable(this_00,0xb90);
  sglr::ContextWrapper::glStencilOp(this_00,0x1e00,0x1e00,0x1e01);
  sglr::ContextWrapper::glStencilFunc(this_00,0x207,1,0xff);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1f8.m_data[0] = 1.0;
  local_1f8.m_data[1] = 0.0;
  local_1f8.m_data[2] = 0.0;
  local_1f8.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_240,&local_1f8,&cScale);
  tcu::operator+((tcu *)&local_230,&local_240,&colorFmtInfo.valueMin);
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar6,program,&local_230);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_230.m_data[0] = -1.0;
  local_230.m_data[1] = -1.0;
  local_230.m_data[2] = -1.0;
  local_240.m_data[0] = 1.0;
  local_240.m_data[1] = 1.0;
  local_240.m_data[2] = 1.0;
  sglr::drawQuad(pCVar6,program,(Vec3 *)&local_230,(Vec3 *)&local_240);
  attachments_00 = (deUint32 *)0x0;
  if ((long)attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 0) {
    attachments_00 =
         attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  sglr::ContextWrapper::glInvalidateSubFramebuffer
            (this_00,0x8d40,
             (int)((ulong)((long)attachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)attachments.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 2),attachments_00,
             local_248,local_24c,(int)local_218,(int)local_220);
  sglr::ContextWrapper::glScissor(this_00,local_248,local_24c,(int)local_218,(int)local_220);
  sglr::ContextWrapper::glEnable(this_00,0xc11);
  uVar7 = this->m_invalidateBuffers;
  if ((uVar7 >> 0xe & 1) != 0) {
    local_1f8.m_data[0] = 0.0;
    local_1f8.m_data[1] = 1.0;
    local_1f8.m_data[2] = 0.0;
    local_1f8.m_data[3] = 1.0;
    tcu::operator*((tcu *)&local_240,&local_1f8,&cScale);
    tcu::operator+((tcu *)&local_230,&local_240,&colorFmtInfo.valueMin);
    sglr::ContextWrapper::glClearBufferfv(this_00,0x1800,0,local_230.m_data);
    uVar7 = this->m_invalidateBuffers;
  }
  sglr::ContextWrapper::glClear(this_00,uVar7 & 0xffffbfff);
  sglr::ContextWrapper::glDisable(this_00,0xc11);
  sglr::ContextWrapper::glEnable(this_00,0xbe2);
  sglr::ContextWrapper::glBlendFunc(this_00,1,1);
  sglr::ContextWrapper::glBlendEquation(this_00,0x8006);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_1f8.m_data[0] = 0.0;
  local_1f8.m_data[1] = 0.0;
  local_1f8.m_data[2] = 1.0;
  local_1f8.m_data[3] = 1.0;
  tcu::operator*((tcu *)&local_240,&local_1f8,&cScale);
  tcu::operator+((tcu *)&local_230,&local_240,&colorFmtInfo.valueMin);
  FboTestUtil::FlatColorShader::setColor(&flatShader,pCVar6,program,&local_230);
  pCVar6 = sglr::ContextWrapper::getCurrentContext(this_00);
  local_230.m_data[0] = -1.0;
  local_230.m_data[1] = -1.0;
  local_230.m_data[2] = 0.0;
  local_240.m_data[0] = 1.0;
  local_240.m_data[1] = 1.0;
  local_240.m_data[2] = 0.0;
  sglr::drawQuad(pCVar6,program,(Vec3 *)&local_230,(Vec3 *)&local_240);
  iVar3 = sglr::ContextWrapper::getWidth(this_00);
  iVar4 = sglr::ContextWrapper::getHeight(this_00);
  FboTestCase::readPixels
            (&this->super_FboTestCase,local_1e8,0,0,iVar3,iVar4,&colorFmt,&colorFmtInfo.lookupScale,
             &colorFmtInfo.lookupBias);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&attachments.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		tcu::TextureFormat		colorFmt				= glu::mapGLInternalFormat(m_colorFmt);
		tcu::TextureFormat		depthStencilFmt			= m_depthStencilFmt != GL_NONE ? glu::mapGLInternalFormat(m_depthStencilFmt) : tcu::TextureFormat();
		tcu::TextureFormatInfo	colorFmtInfo			= tcu::getTextureFormatInfo(colorFmt);
		bool					depth					= depthStencilFmt.order == tcu::TextureFormat::D || depthStencilFmt.order == tcu::TextureFormat::DS;
		bool					stencil					= depthStencilFmt.order == tcu::TextureFormat::S || depthStencilFmt.order == tcu::TextureFormat::DS;
		const tcu::Vec4&		cBias					= colorFmtInfo.valueMin;
		tcu::Vec4				cScale					= colorFmtInfo.valueMax-colorFmtInfo.valueMin;
		deUint32				fbo						= 0;
		deUint32				colorRbo				= 0;
		deUint32				depthStencilRbo			= 0;
		int						invalidateX				= getWidth()	/ 4;
		int						invalidateY				= getHeight()	/ 4;
		int						invalidateW				= getWidth()	/ 2;
		int						invalidateH				= getHeight()	/ 2;
		FlatColorShader			flatShader				(glu::TYPE_FLOAT_VEC4);
		vector<deUint32>		attachments				= getFBODiscardAttachments(m_invalidateBuffers);
		deUint32				flatShaderID			= getCurrentContext()->createProgram(&flatShader);

		// Create fbo.
		glGenRenderbuffers		(1, &colorRbo);
		glBindRenderbuffer		(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage	(GL_RENDERBUFFER, m_colorFmt, getWidth(), getHeight());

		if (m_depthStencilFmt != GL_NONE)
		{
			glGenRenderbuffers		(1, &depthStencilRbo);
			glBindRenderbuffer		(GL_RENDERBUFFER, depthStencilRbo);
			glRenderbufferStorage	(GL_RENDERBUFFER, m_depthStencilFmt, getWidth(), getHeight());
		}

		glGenFramebuffers			(1, &fbo);
		glBindFramebuffer			(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer	(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);

		if (depth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		if (stencil)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);

		checkFramebufferStatus		(GL_FRAMEBUFFER);

		glClearBufferfv	(GL_COLOR, 0, (Vec4(0.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias).getPtr());
		glClearBufferfi	(GL_DEPTH_STENCIL, 0, 1.0f, 0);

		glEnable		(GL_DEPTH_TEST);
		glEnable		(GL_STENCIL_TEST);
		glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);
		glStencilFunc	(GL_ALWAYS, 1, 0xff);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

		glInvalidateSubFramebuffer(GL_FRAMEBUFFER, (int)attachments.size(), attachments.empty() ? DE_NULL : &attachments[0], invalidateX, invalidateY, invalidateW, invalidateH);

		// Clear invalidated buffers.
		glScissor	(invalidateX, invalidateY, invalidateW, invalidateH);
		glEnable	(GL_SCISSOR_TEST);

		if (m_invalidateBuffers & GL_COLOR_BUFFER_BIT)
			glClearBufferfv(GL_COLOR, 0, (Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias).getPtr());

		glClear		(m_invalidateBuffers & ~GL_COLOR_BUFFER_BIT);
		glDisable	(GL_SCISSOR_TEST);

		glEnable		(GL_BLEND);
		glBlendFunc		(GL_ONE, GL_ONE);
		glBlendEquation	(GL_FUNC_ADD);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f)*cScale + cBias);
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		readPixels(dst, 0, 0, getWidth(), getHeight(), colorFmt, colorFmtInfo.lookupScale, colorFmtInfo.lookupBias);
	}